

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::StringToInt64Map::ByteSizeLong(StringToInt64Map *this)

{
  value_type *key;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
  sVar1;
  EntryType *pEVar2;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
  *value;
  size_t sVar3;
  size_t sVar4;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
  entry;
  const_iterator it;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
  local_50;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  local_48;
  
  sVar4 = (size_t)(uint)((this->map_).map_.elements_)->num_elements_;
  local_50.ptr_ = (EntryType *)0x0;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::begin
            ((const_iterator *)&local_48,&(this->map_).map_);
  while (local_48.node_ != (Node *)0x0) {
    key = ((local_48.node_)->kv).v_;
    pEVar2 = google::protobuf::internal::
             MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
             ::NewEntryWrapper(&this->map_,&key->first,&key->second);
    sVar1.ptr_ = local_50.ptr_;
    if ((local_50.ptr_ != pEVar2) && (sVar1.ptr_ = pEVar2, local_50.ptr_ != (EntryType *)0x0)) {
      (*((local_50.ptr_)->
        super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
        ).super_MessageLite._vptr_MessageLite[1])();
    }
    local_50.ptr_ = sVar1.ptr_;
    value = google::protobuf::internal::
            scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>_>
            ::operator*(&local_50);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::internal::MapEntryLite<std::__cxx11::string,long,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)3,0>>
                      (value);
    sVar4 = sVar4 + sVar3;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
    InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
    ::operator++(&local_48);
  }
  if (local_50.ptr_ != (EntryType *)0x0) {
    (*((local_50.ptr_)->
      super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
      ).super_MessageLite._vptr_MessageLite[1])();
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t StringToInt64Map::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringToInt64Map)
  size_t total_size = 0;

  // map<string, int64> map = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->map_size());
  {
    ::google::protobuf::scoped_ptr<StringToInt64Map_MapEntry> entry;
    for (::google::protobuf::Map< ::std::string, ::google::protobuf::int64 >::const_iterator
        it = this->map().begin();
        it != this->map().end(); ++it) {
      entry.reset(map_.NewEntryWrapper(it->first, it->second));
      total_size += ::google::protobuf::internal::WireFormatLite::
          MessageSizeNoVirtual(*entry);
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}